

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

void hts_idx_destroy(hts_idx_t *idx)

{
  bidx_t *__ptr;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if (idx != (hts_idx_t *)0x0) {
    if (idx->fmt != 3) {
      if (0 < idx->m) {
        lVar4 = 0;
        do {
          __ptr = idx->bidx[lVar4];
          free(idx->lidx[lVar4].offset);
          if (__ptr != (bidx_t *)0x0) {
            if (__ptr->n_buckets != 0) {
              bVar1 = 0;
              uVar3 = 0;
              do {
                if ((__ptr->flags[uVar3 >> 4] >> (bVar1 & 0x1e) & 3) == 0) {
                  free(__ptr->vals[uVar3].list);
                }
                uVar2 = (int)uVar3 + 1;
                uVar3 = (ulong)uVar2;
                bVar1 = bVar1 + 2;
              } while (uVar2 != __ptr->n_buckets);
            }
            free(__ptr->keys);
            free(__ptr->flags);
            free(__ptr->vals);
            free(__ptr);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < idx->m);
      }
      free(idx->bidx);
      free(idx->lidx);
      free(idx->meta);
    }
    free(idx);
    return;
  }
  return;
}

Assistant:

void hts_idx_destroy(hts_idx_t *idx)
{
    khint_t k;
    int i;
    if (idx == 0) return;
    // For HTS_FMT_CRAI, idx actually points to a different type -- see sam.c
    if (idx->fmt == HTS_FMT_CRAI) { free(idx); return; }

    for (i = 0; i < idx->m; ++i) {
        bidx_t *bidx = idx->bidx[i];
        free(idx->lidx[i].offset);
        if (bidx == 0) continue;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k)
            if (kh_exist(bidx, k))
                free(kh_value(bidx, k).list);
        kh_destroy(bin, bidx);
    }
    free(idx->bidx); free(idx->lidx); free(idx->meta);
    free(idx);
}